

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapePrism>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  double dVar1;
  double dVar2;
  int64_t iVar3;
  long row;
  double *pdVar4;
  TPZFMatrix<double> *in_RCX;
  long *in_RDX;
  long in_RSI;
  int d;
  int scalindex;
  int vecindex;
  pair<int,_long> it;
  int i;
  int dim;
  int nsides;
  int ncorner;
  TPZShapeData *in_stack_00001648;
  TPZVec<double> *in_stack_00001650;
  double in_stack_ffffffffffffff90;
  TPZFMatrix<double> *this;
  int local_4c;
  int local_30;
  
  this = in_RCX;
  iVar3 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510));
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (this,iVar3,1);
  (*(in_RCX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  iVar3 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510));
  (**(code **)(*in_RDX + 0x68))(in_RDX,3,iVar3);
  (**(code **)(*in_RDX + 0x78))();
  TPZShapeH1<pzshape::TPZShapePrism>::Shape(in_stack_00001650,in_stack_00001648);
  local_30 = 0;
  while( true ) {
    row = (long)local_30;
    iVar3 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510));
    if (iVar3 <= row) break;
    TPZVec<std::pair<int,_long>_>::operator[]
              ((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510),(long)local_30);
    pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
    *pdVar4 = 0.0;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      dVar2 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      *pdVar4 = dVar1 * dVar2;
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      dVar1 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff90 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()(this,row,(int64_t)in_stack_ffffffffffffff90);
      *pdVar4 = dVar1 * in_stack_ffffffffffffff90 + *pdVar4;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{
    
    divphi.Resize(data.fSDVecShapeIndex.size(),1);
    divphi.Zero();
    phi.Resize(TSHAPE::Dimension,data.fSDVecShapeIndex.size());
    phi.Zero();

    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        auto it = data.fSDVecShapeIndex[i];
        int vecindex = it.first;
        int scalindex = it.second;
        divphi(i,0) = 0.;
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
            divphi(i,0) += data.fDPhi(d,scalindex)*data.fMasterDirections(d,vecindex);
        }
    }
}